

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUrightNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *rhs,int *ridx,int rn,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  self_type *in_RDI;
  int in_R8D;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cval;
  int *cbeg;
  int *clen;
  int *cidx;
  int *rperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff988;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff990;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  undefined1 local_63c [52];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa00;
  undefined1 local_5cc [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_594;
  undefined1 local_55c [56];
  undefined4 local_524;
  undefined1 local_520 [56];
  undefined1 local_4e8 [56];
  undefined4 local_4b0;
  undefined1 local_4ac [56];
  undefined1 local_474 [56];
  undefined1 local_43c [56];
  undefined1 local_404 [56];
  undefined4 local_3cc;
  undefined1 local_3c8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  int *local_388;
  undefined1 local_380 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2b4;
  int *local_2b0;
  long local_2a8;
  long local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  undefined4 *local_280;
  long local_278;
  undefined4 *local_270;
  long local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  undefined1 *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined1 *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  long local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  long local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  long local_188;
  undefined4 *local_180;
  undefined4 *local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  reference local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  reference local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  reference local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  reference local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_290 = &local_348;
  local_2b4 = in_R8D;
  local_2b0 = in_RCX;
  local_2a8 = in_RDX;
  local_2a0 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff990);
  local_288 = local_380;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff990);
  local_2e0 = *(long *)(in_RDI[5].m_backend.data._M_elems + 4);
  local_2e8 = *(long *)(in_RDI[5].m_backend.data._M_elems + 8);
  local_2f0 = *(long *)(in_RDI[5].m_backend.data._M_elems + 6);
  local_2f8 = *(long *)(in_RDI[0xb].m_backend.data._M_elems + 2);
  local_310 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x39bda8);
  local_300._0_4_ = in_RDI[0xb].m_backend.fpclass;
  local_300._4_4_ = in_RDI[0xb].m_backend.prec_elem;
  local_308._0_4_ = in_RDI[0xb].m_backend.exp;
  local_308._4_1_ = in_RDI[0xb].m_backend.neg;
  local_308._5_3_ = *(undefined3 *)&in_RDI[0xb].m_backend.field_0x2d;
LAB_0039bdd6:
  if (0 < local_2b4) {
    if ((double)local_2b4 <= (double)*local_2b0 * 0.2) {
      local_2c4 = deQueueMax(local_2b0,&local_2b4);
      local_2d0 = *(int *)(local_2e0 + (long)local_2c4 * 4);
      local_e0 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI[8].m_backend.data._M_elems + 4),(long)local_2d0);
      local_e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(local_2a8 + (long)local_2d0 * 0x38);
      local_d8 = local_4ac;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e0,local_e8);
      local_d0 = local_4ac;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff990);
      local_b8 = local_4ac;
      local_c0 = local_e0;
      local_c8 = local_e8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                 (cpp_dec_float<50U,_int,_void> *)0x39c358);
      local_1e8 = &local_348;
      local_1f0 = local_4ac;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      local_4b0 = 0;
      local_278 = local_2a8 + (long)local_2d0 * 0x38;
      local_280 = &local_4b0;
      local_178 = local_280;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff990,(long_long_type)in_stack_fffffffffffff988);
      local_238 = local_4e8;
      local_240 = &local_348;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      local_228 = local_520;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      if (bVar2) {
        local_2d4 = *(int *)(local_2e8 + (long)local_2c4 * 4);
        local_198 = local_2a0 + (long)local_2d4 * 0x38;
        local_1a0 = &local_348;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        local_390 = local_310 + *(int *)(local_308 + (long)local_2d4 * 4);
        local_388 = (int *)(local_2f8 + (long)*(int *)(local_308 + (long)local_2d4 * 4) * 4);
        local_2c8 = *(int *)(local_300 + (long)local_2d4 * 4);
        while (iVar4 = local_2c8 + -1, bVar2 = 0 < local_2c8, local_2c8 = iVar4, bVar2) {
          local_2cc = *local_388;
          local_1b0 = local_2a8 + (long)local_2cc * 0x38;
          local_1a8 = local_380;
          local_388 = local_388 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          local_524 = 0;
          tVar3 = boost::multiprecision::operator==
                            (in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
          pnVar1 = local_390;
          if (tVar3) {
            local_20 = &local_594;
            local_28 = &local_348;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_29,local_28);
            local_10 = &local_594;
            local_18 = local_28;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            local_8 = &local_594;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                      (in_stack_fffffffffffff990);
            pnVar1 = local_390;
            local_118 = local_55c;
            local_120 = &local_594;
            local_128 = local_390;
            local_390 = local_390 + 1;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_129,local_120,pnVar1);
            local_110 = local_55c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_fffffffffffff990);
            local_f8 = local_55c;
            local_100 = local_120;
            local_108 = local_128;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                       (cpp_dec_float<50U,_int,_void> *)0x39c738);
            local_1f8 = local_380;
            local_200 = local_55c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            local_218 = local_5cc;
            local_220 = local_380;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            local_208 = &stack0xfffffffffffff9fc;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
            if (bVar2) {
              local_1b8 = local_2a8 + (long)local_2cc * 0x38;
              local_1c0 = local_380;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
              enQueueMax(local_2b0,&local_2b4,*(int *)(local_2f0 + (long)local_2cc * 4));
            }
          }
          else {
            local_158 = local_63c;
            local_160 = &local_348;
            local_168 = local_390;
            local_390 = local_390 + 1;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_169,local_160,pnVar1);
            local_150 = local_63c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_fffffffffffff990);
            local_138 = local_63c;
            local_140 = local_160;
            local_148 = local_168;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                       (cpp_dec_float<50U,_int,_void> *)0x39c917);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),in_RDI);
            in_stack_fffffffffffff9b4 = 0;
            tVar3 = boost::multiprecision::operator==
                              (in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff990);
            in_stack_fffffffffffff990 = (cpp_dec_float<50U,_int,_void> *)0x0;
            in_stack_fffffffffffff998 =
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)0x2b2bff2ee48e0530;
            if (!tVar3) {
              in_stack_fffffffffffff998 =
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x0;
            }
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            ::operator+=(in_stack_fffffffffffff998,(double *)0x0);
            local_1c8 = local_2a8 + (long)local_2cc * 0x38;
            local_1d0 = local_380;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          }
        }
      }
      goto LAB_0039bdd6;
    }
    for (local_2c4 = *local_2b0; -1 < local_2c4; local_2c4 = local_2c4 + -1) {
      local_2d0 = *(int *)(local_2e0 + (long)local_2c4 * 4);
      local_60 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI[8].m_backend.data._M_elems + 4),(long)local_2d0);
      local_68 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(local_2a8 + (long)local_2d0 * 0x38);
      local_58 = local_3c8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_69,local_60,local_68);
      local_50 = local_3c8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff990);
      local_38 = local_3c8;
      local_40 = local_60;
      local_48 = local_68;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                 (cpp_dec_float<50U,_int,_void> *)0x39bf22);
      local_1d8 = &local_348;
      local_1e0 = local_3c8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      local_3cc = 0;
      local_268 = local_2a8 + (long)local_2d0 * 0x38;
      local_270 = &local_3cc;
      local_180 = local_270;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff990,(long_long_type)in_stack_fffffffffffff988);
      local_258 = local_404;
      local_260 = &local_348;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      local_248 = local_43c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      if (bVar2) {
        local_2d4 = *(int *)(local_2e8 + (long)local_2c4 * 4);
        local_188 = local_2a0 + (long)local_2d4 * 0x38;
        local_190 = &local_348;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        local_390 = local_310 + *(int *)(local_308 + (long)local_2d4 * 4);
        local_388 = (int *)(local_2f8 + (long)*(int *)(local_308 + (long)local_2d4 * 4) * 4);
        local_2c8 = *(int *)(local_300 + (long)local_2d4 * 4);
        while (pnVar1 = local_390, iVar4 = local_2c8 + -1, bVar2 = 0 < local_2c8, local_2c8 = iVar4,
              bVar2) {
          local_98 = local_474;
          local_a0 = &local_348;
          local_a8 = local_390;
          local_390 = local_390 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,local_a0,pnVar1);
          local_90 = local_474;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff990);
          local_78 = local_474;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                     (cpp_dec_float<50U,_int,_void> *)0x39c1ee);
          local_388 = local_388 + 1;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),in_RDI);
        }
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}